

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

void FlatStream_Close(TBlockStream *pStream)

{
  FILE_BITMAP_FOOTER Footer;
  
  if ((pStream->FileBitmap != (void *)0x0) && (pStream->IsModified != 0)) {
    (*(pStream->super_TFileStream).BaseWrite)
              (&pStream->super_TFileStream,&(pStream->super_TFileStream).StreamSize,
               pStream->FileBitmap,pStream->BitmapSize);
    Footer.Signature = 0x33767470;
    Footer.Version = 3;
    Footer.BuildNumber = (pStream->super_TFileStream).BuildNumber;
    Footer._12_8_ = (pStream->super_TFileStream).StreamSize;
    Footer.BlockSize = pStream->BlockSize;
    (*(pStream->super_TFileStream).BaseWrite)
              (&pStream->super_TFileStream,(ULONGLONG *)0x0,&Footer,0x18);
  }
  BlockStream_Close(pStream);
  return;
}

Assistant:

static void FlatStream_Close(TBlockStream * pStream)
{
    FILE_BITMAP_FOOTER Footer;

    if(pStream->FileBitmap && pStream->IsModified)
    {
        // Write the file bitmap
        pStream->BaseWrite(pStream, &pStream->StreamSize, pStream->FileBitmap, pStream->BitmapSize);

        // Prepare and write the file footer
        Footer.Signature   = ID_FILE_BITMAP_FOOTER;
        Footer.Version     = 3;
        Footer.BuildNumber = pStream->BuildNumber;
        Footer.MapOffsetLo = (DWORD)(pStream->StreamSize & 0xFFFFFFFF);
        Footer.MapOffsetHi = (DWORD)(pStream->StreamSize >> 0x20);
        Footer.BlockSize   = pStream->BlockSize;
        BSWAP_ARRAY32_UNSIGNED(&Footer, sizeof(FILE_BITMAP_FOOTER));
        pStream->BaseWrite(pStream, NULL, &Footer, sizeof(FILE_BITMAP_FOOTER));
    }

    // Close the base class
    BlockStream_Close(pStream);
}